

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImVec2 IVar1;
  ImGuiID IVar2;
  ImGuiWindow *window;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ImGuiContext *g;
  char cVar12;
  long lVar13;
  uint uVar14;
  bool bVar15;
  ImVec2 IVar16;
  float fVar17;
  
  pIVar4 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (((uint)flags >> 10 & 1) != 0) {
    if (out_hovered != (bool *)0x0) {
      *out_hovered = false;
    }
    if (out_held != (bool *)0x0) {
      *out_held = false;
    }
    if (pIVar4->ActiveId == id) {
      ClearActiveID();
    }
    return false;
  }
  uVar11 = flags | 0x10000;
  if ((flags & 0x70000U) != 0) {
    uVar11 = flags;
  }
  uVar14 = uVar11 | 4;
  if ((uVar11 & 0x7e) != 0) {
    uVar14 = uVar11;
  }
  if ((char)(byte)uVar14 < '\0') {
    bVar8 = pIVar4->HoveredRootWindow == window;
  }
  else {
    bVar8 = false;
  }
  pIVar3 = pIVar4->HoveredWindow;
  if (bVar8) {
    pIVar4->HoveredWindow = window;
  }
  bVar5 = ItemHoverable(bb,id);
  if (((bVar5) && (pIVar4->DragDropActive == true)) && ((pIVar4->DragDropPayload).SourceId == id)) {
    bVar5 = (bool)(bVar5 & ((byte)pIVar4->DragDropSourceFlags & 2) >> 1);
  }
  bVar6 = false;
  if (((uVar14 & 0x40) != 0) && (pIVar4->DragDropActive != false)) {
    if ((pIVar4->DragDropSourceFlags & 4) == 0) {
      bVar6 = IsItemHovered(0x20);
      if (bVar6) {
        SetHoveredID(id);
        fVar17 = pIVar4->HoveredIdTimer + 0.0001;
        iVar9 = CalcTypematicRepeatAmount(fVar17 - (pIVar4->IO).DeltaTime,fVar17,0.7,0.0);
        if (iVar9 == 0) {
          bVar5 = true;
          bVar6 = false;
        }
        else {
          pIVar4->DragDropHoldJustPressedId = id;
          FocusWindow(window);
          bVar5 = true;
          bVar6 = true;
        }
      }
      else {
        bVar6 = false;
      }
    }
    else {
      bVar6 = false;
    }
  }
  if (bVar8) {
    pIVar4->HoveredWindow = pIVar3;
  }
  if (bVar5 == true && (uVar14 >> 8 & 1) != 0) {
    bVar5 = (bool)(bVar5 & (pIVar4->HoveredIdPreviousFrame == 0 ||
                           pIVar4->HoveredIdPreviousFrame == id));
  }
  if (bVar5 != false) {
    if (((uVar14 >> 0xc & 1) == 0) ||
       ((((pIVar4->IO).KeyCtrl == false && ((pIVar4->IO).KeyShift == false)) &&
        ((pIVar4->IO).KeyAlt == false)))) {
      if ((uVar14 >> 0x10 & 1) == 0) {
LAB_0015d18c:
        if (((uVar14 >> 0x11 & 1) == 0) || ((pIVar4->IO).MouseClicked[1] == false)) {
          if ((uVar14 >> 0x12 & 1) == 0) {
            uVar11 = 0xffffffff;
            bVar7 = 1;
          }
          else {
            bVar7 = (pIVar4->IO).MouseClicked[2] ^ 1;
            uVar11 = -(uint)bVar7 | 2;
          }
        }
        else {
          uVar11 = 1;
          bVar7 = 0;
        }
      }
      else {
        bVar7 = 0;
        uVar11 = 0;
        if ((pIVar4->IO).MouseClicked[0] == false) goto LAB_0015d18c;
      }
      if (((uVar14 >> 0x10 & 1) == 0) || ((pIVar4->IO).MouseReleased[0] == false)) {
        if (((uVar14 >> 0x11 & 1) == 0) || ((pIVar4->IO).MouseReleased[1] == false)) {
          lVar13 = 0xffffffff;
          if ((uVar14 >> 0x12 & 1) == 0) {
            cVar12 = '\0';
          }
          else {
            cVar12 = (pIVar4->IO).MouseReleased[2];
            if ((bool)cVar12 != false) {
              lVar13 = 2;
            }
          }
        }
        else {
          lVar13 = 1;
          cVar12 = '\x01';
        }
      }
      else {
        cVar12 = '\x01';
        lVar13 = 0;
      }
      if ((bVar7 == 0) && (pIVar4->ActiveId != id)) {
        if ((uVar14 & 0xc) != 0) {
          SetActiveID(id,window);
          pIVar4->ActiveIdMouseButton = uVar11;
          if ((uVar14 >> 0xe & 1) == 0) {
            SetFocusID(id,window);
          }
          FocusWindow(window);
        }
        if (((uVar14 & 2) != 0) ||
           (((uVar14 & 0x20) != 0 && ((pIVar4->IO).MouseDoubleClicked[uVar11] == true)))) {
          if ((uVar14 >> 0xd & 1) == 0) {
            SetActiveID(id,window);
          }
          else {
            ClearActiveID();
          }
          pIVar4->ActiveIdMouseButton = uVar11;
          FocusWindow(window);
          bVar6 = true;
        }
      }
      if (cVar12 == '\x01' && (uVar14 & 0x10) != 0) {
        if (((uVar14 & 1) == 0) ||
           ((pIVar4->IO).MouseDownDurationPrev[lVar13] < (pIVar4->IO).KeyRepeatDelay)) {
          bVar6 = true;
        }
        ClearActiveID();
      }
      if (((((uVar14 & 1) != 0) && (pIVar4->ActiveId == id)) &&
          (0.0 < (pIVar4->IO).MouseDownDuration[pIVar4->ActiveIdMouseButton])) &&
         (bVar8 = IsMouseClicked(pIVar4->ActiveIdMouseButton,true), bVar8)) {
        bVar6 = true;
      }
    }
    if (bVar6) {
      pIVar4->NavDisableHighlight = true;
    }
  }
  if (((pIVar4->NavId == id) && (pIVar4->NavDisableHighlight == false)) &&
     (pIVar4->NavDisableMouseHover == true)) {
    IVar2 = pIVar4->ActiveId;
    if (IVar2 == id || IVar2 == 0) {
      if ((short)uVar14 < 0) goto LAB_0015d3f7;
    }
    else if (((short)uVar14 < 0) || (IVar2 != window->MoveId)) goto LAB_0015d3f7;
    bVar5 = true;
  }
LAB_0015d3f7:
  if (pIVar4->NavActivateDownId == id) {
    bVar15 = pIVar4->NavActivateId == id;
    fVar17 = GetNavInputAmount(0,(uVar14 & 1) * 2 + ImGuiInputReadMode_Pressed);
    bVar8 = true;
    if ((0.0 < fVar17 || bVar15) || (bVar8 = bVar6, pIVar4->ActiveId == id)) {
      bVar6 = bVar8;
      pIVar4->NavActivateId = id;
      SetActiveID(id,window);
      if ((0.0 < fVar17 || bVar15) && (uVar14 >> 0xe & 1) == 0) {
        SetFocusID(id,window);
      }
    }
  }
  if (pIVar4->ActiveId == id) {
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar4->NavActivateDownId != id) {
        ClearActiveID();
      }
      bVar8 = false;
    }
    else if (pIVar4->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (pIVar4->ActiveIdIsJustActivated == true) {
        IVar1 = (pIVar4->IO).MousePos;
        IVar16.x = IVar1.x - (bb->Min).x;
        IVar16.y = IVar1.y - (bb->Min).y;
        pIVar4->ActiveIdClickOffset = IVar16;
      }
      uVar10 = (ulong)(uint)pIVar4->ActiveIdMouseButton;
      if (4 < uVar10) {
        __assert_fail("mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                      ,0x25e,
                      "bool ImGui::ButtonBehavior(const ImRect &, ImGuiID, bool *, bool *, ImGuiButtonFlags)"
                     );
      }
      bVar8 = true;
      if ((pIVar4->IO).MouseDown[uVar10] == false) {
        bVar8 = bVar6;
        if ((((uVar14 & 8) != 0) || (((byte)uVar14 >> 2 & bVar5) != 0)) &&
           (pIVar4->DragDropActive == false)) {
          if ((uVar14 & 0x20) == 0) {
            cVar12 = '\0';
          }
          else {
            cVar12 = (pIVar4->IO).MouseDownWasDoubleClick[uVar10];
          }
          if ((uVar14 & 1) == 0) {
            bVar15 = false;
          }
          else {
            bVar15 = (pIVar4->IO).KeyRepeatDelay <= (pIVar4->IO).MouseDownDurationPrev[uVar10];
          }
          if ((cVar12 == '\0') && (bVar8 = true, bVar15)) {
            bVar8 = bVar6;
          }
        }
        bVar6 = bVar8;
        ClearActiveID();
        bVar8 = false;
      }
      if ((uVar14 >> 0xe & 1) == 0) {
        pIVar4->NavDisableHighlight = true;
      }
    }
    else {
      bVar8 = false;
    }
    if (bVar6 != false) {
      pIVar4->ActiveIdHasBeenPressedBefore = true;
    }
  }
  else {
    bVar8 = false;
  }
  if (out_hovered != (bool *)0x0) {
    *out_hovered = bVar5;
  }
  if (out_held != (bool *)0x0) {
    *out_held = bVar8;
  }
  return bVar6;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) ClearActiveID();
        return false;
    }

    // Default only reacts to left mouse button
    if ((flags & ImGuiButtonFlags_MouseButtonMask_) == 0)
        flags |= ImGuiButtonFlags_MouseButtonDefault_;

    // Default behavior requires click + release inside bounding box
    if ((flags & ImGuiButtonFlags_PressedOnMask_) == 0)
        flags |= ImGuiButtonFlags_PressedOnDefault_;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && window->DC.LastItemId != id)
        IMGUI_TEST_ENGINE_ITEM_ADD(bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            const float DRAG_DROP_HOLD_TIMER = 0.70f;
            hovered = true;
            SetHoveredID(id);
            if (CalcTypematicRepeatAmount(g.HoveredIdTimer + 0.0001f - g.IO.DeltaTime, g.HoveredIdTimer + 0.0001f, DRAG_DROP_HOLD_TIMER, 0.00f))
            {
                pressed = true;
                g.DragDropHoldJustPressedId = id;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse handling
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            // Poll buttons
            int mouse_button_clicked = -1;
            int mouse_button_released = -1;
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseClicked[0])         { mouse_button_clicked = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseClicked[1])   { mouse_button_clicked = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseClicked[2])  { mouse_button_clicked = 2; }
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseReleased[0])        { mouse_button_released = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseReleased[1])  { mouse_button_released = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseReleased[2]) { mouse_button_released = 2; }

            if (mouse_button_clicked != -1 && g.ActiveId != id)
            {
                if (flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClickReleaseAnywhere))
                {
                    SetActiveID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    FocusWindow(window);
                }
                if ((flags & ImGuiButtonFlags_PressedOnClick) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[mouse_button_clicked]))
                {
                    pressed = true;
                    if (flags & ImGuiButtonFlags_NoHoldingActiveId)
                        ClearActiveID();
                    else
                        SetActiveID(id, window); // Hold on ID
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    FocusWindow(window);
                }
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && mouse_button_released != -1)
            {
                // Repeat mode trumps on release behavior
                if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button_released] >= g.IO.KeyRepeatDelay))
                    pressed = true;
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if (g.ActiveId == id && (flags & ImGuiButtonFlags_Repeat))
                if (g.IO.MouseDownDuration[g.ActiveIdMouseButton] > 0.0f && IsMouseClicked(g.ActiveIdMouseButton, true))
                    pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnFocus))
            hovered = true;
    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputTest(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
            pressed = true;
        if (nav_activated_by_code || nav_activated_by_inputs || g.ActiveId == id)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            g.NavActivateId = id; // This is so SetActiveId assign a Nav source
            SetActiveID(id, window);
            if ((nav_activated_by_code || nav_activated_by_inputs) && !(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;

            const int mouse_button = g.ActiveIdMouseButton;
            IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
            if (g.IO.MouseDown[mouse_button])
            {
                held = true;
            }
            else
            {
                bool release_in = hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) != 0;
                bool release_anywhere = (flags & ImGuiButtonFlags_PressedOnClickReleaseAnywhere) != 0;
                if ((release_in || release_anywhere) && !g.DragDropActive)
                {
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDownWasDoubleClick[mouse_button];
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}